

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysextest.cpp
# Opt level: O0

bool chooseMidiPort(RtMidi *rtmidi)

{
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  allocator<char> local_101;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  uint local_a0;
  uint local_9c;
  uint nPorts;
  uint i;
  string portName;
  string local_70 [48];
  undefined1 local_40 [8];
  string keyHit;
  bool isInput;
  RtMidi *rtmidi_local;
  
  keyHit.field_2._M_local_buf[0xf] = '\0';
  if (rtmidi == (RtMidi *)0x0) {
    __cxa_bad_typeid();
  }
  bVar2 = std::type_info::operator==
                    (*(type_info **)(*(long *)rtmidi + -8),(type_info *)&RtMidiIn::typeinfo);
  if (bVar2) {
    keyHit.field_2._M_local_buf[0xf] = '\x01';
  }
  if ((keyHit.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::operator<<((ostream *)&std::cout,"\nWould you like to open a virtual output port? [y/N] ");
  }
  else {
    std::operator<<((ostream *)&std::cout,"\nWould you like to open a virtual input port? [y/N] ");
  }
  std::__cxx11::string::string((string *)local_40);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)local_40);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"y");
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_70,"RtMidi",(allocator<char> *)(portName.field_2._M_local_buf + 0xf));
    (**(code **)(*(long *)rtmidi + 8))(rtmidi,local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)(portName.field_2._M_local_buf + 0xf));
    rtmidi_local._7_1_ = true;
    portName.field_2._8_4_ = 1;
  }
  else {
    std::__cxx11::string::string((string *)&nPorts);
    local_9c = 0;
    local_a0 = (**(code **)(*(long *)rtmidi + 0x10))();
    if (local_a0 == 0) {
      if ((keyHit.field_2._M_local_buf[0xf] & 1U) == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"No output ports available!");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"No input ports available!");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      rtmidi_local._7_1_ = false;
    }
    else {
      if (local_a0 == 1) {
        poVar3 = std::operator<<((ostream *)&std::cout,"\nOpening ");
        (**(code **)(*(long *)rtmidi + 0x18))(local_c0,rtmidi,0);
        poVar3 = std::operator<<(poVar3,local_c0);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_c0);
      }
      else {
        for (local_9c = 0; local_9c < local_a0; local_9c = local_9c + 1) {
          (**(code **)(*(long *)rtmidi + 0x18))(local_e0,rtmidi,local_9c);
          std::__cxx11::string::operator=((string *)&nPorts,local_e0);
          std::__cxx11::string::~string(local_e0);
          if ((keyHit.field_2._M_local_buf[0xf] & 1U) == 0) {
            poVar3 = std::operator<<((ostream *)&std::cout,"  Output port #");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_9c);
            poVar3 = std::operator<<(poVar3,": ");
            poVar3 = std::operator<<(poVar3,(string *)&nPorts);
            std::operator<<(poVar3,'\n');
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cout,"  Input port #");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_9c);
            poVar3 = std::operator<<(poVar3,": ");
            poVar3 = std::operator<<(poVar3,(string *)&nPorts);
            std::operator<<(poVar3,'\n');
          }
        }
        do {
          std::operator<<((ostream *)&std::cout,"\nChoose a port number: ");
          std::istream::operator>>((istream *)&std::cin,&local_9c);
        } while (local_a0 <= local_9c);
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      uVar1 = local_9c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_100,"RtMidi",&local_101);
      (*(code *)**(undefined8 **)rtmidi)(rtmidi,uVar1,local_100);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator(&local_101);
      rtmidi_local._7_1_ = true;
    }
    portName.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)&nPorts);
  }
  std::__cxx11::string::~string((string *)local_40);
  return rtmidi_local._7_1_;
}

Assistant:

bool chooseMidiPort( RtMidi *rtmidi )
{
  bool isInput = false;
  if ( typeid( *rtmidi ) == typeid( RtMidiIn ) )
    isInput = true;

  if ( isInput )
    std::cout << "\nWould you like to open a virtual input port? [y/N] ";
  else
    std::cout << "\nWould you like to open a virtual output port? [y/N] ";

  std::string keyHit;
  std::getline( std::cin, keyHit );
  if ( keyHit == "y" ) {
    rtmidi->openVirtualPort();
    return true;
  }

  std::string portName;
  unsigned int i = 0, nPorts = rtmidi->getPortCount();
  if ( nPorts == 0 ) {
    if ( isInput )
      std::cout << "No input ports available!" << std::endl;
    else
      std::cout << "No output ports available!" << std::endl;
    return false;
  }

  if ( nPorts == 1 ) {
    std::cout << "\nOpening " << rtmidi->getPortName() << std::endl;
  }
  else {
    for ( i=0; i<nPorts; i++ ) {
      portName = rtmidi->getPortName(i);
      if ( isInput )
        std::cout << "  Input port #" << i << ": " << portName << '\n';
      else
        std::cout << "  Output port #" << i << ": " << portName << '\n';
    }

    do {
      std::cout << "\nChoose a port number: ";
      std::cin >> i;
    } while ( i >= nPorts );
  }

  std::cout << std::endl;
  rtmidi->openPort( i );

  return true;
}